

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-3.cpp
# Opt level: O3

void requestPage(string *url)

{
  pointer pcVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string hostname;
  string service;
  string path;
  resolver resolver;
  query query;
  error_code local_1b0;
  long *local_1a0 [2];
  long local_190 [2];
  string local_180;
  string local_160;
  string local_140;
  undefined1 local_120 [16];
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_e0;
  basic_resolver_query<boost::asio::ip::tcp> local_98;
  
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  parseURL(url,&local_160,&local_180,&local_140);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&local_e0,&io_service,(type *)0x0);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            (&local_98,&local_180,&local_160,address_configured);
  pcVar1 = (url->_M_dataplus)._M_p;
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,pcVar1,pcVar1 + url->_M_string_length);
  boost::
  bind<void,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::__cxx11::string,boost::arg<1>(*)(),boost::arg<2>(*)(),std::__cxx11::string>
            ((bind_t<void,_void_(*)(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::_bi::list3<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_120,(boost *)resolveHandler,boost::asio::placeholders::error,
             boost::asio::placeholders::iterator,(_func_arg<2> *)local_1a0,in_R9);
  boost::asio::detail::resolver_service<boost::asio::ip::tcp>::
  async_resolve<boost::_bi::bind_t<void,void(*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::__cxx11::string),boost::_bi::list3<boost::arg<1>(*)(),boost::arg<2>(*)(),boost::_bi::value<std::__cxx11::string>>>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            (local_e0.service_,&local_e0.implementation_,&local_98,
             (bind_t<void,_void_(*)(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::_bi::list3<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_120,&local_e0.executor_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._8_8_ != &local_108) {
    operator_delete((void *)local_120._8_8_,local_108._M_allocated_capacity + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  local_1b0.val_ = 0;
  local_1b0._4_4_ = local_1b0._4_4_ & 0xffffff00;
  local_1b0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::detail::scheduler::run(io_service.impl_,&local_1b0);
  local_108._M_allocated_capacity = (size_type)local_1b0.cat_;
  if (local_1b0.failed_ != true) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.service_name_._M_dataplus._M_p != &local_98.service_name_.field_2) {
      operator_delete(local_98.service_name_._M_dataplus._M_p,
                      local_98.service_name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.host_name_._M_dataplus._M_p != &local_98.host_name_.field_2) {
      operator_delete(local_98.host_name_._M_dataplus._M_p,
                      local_98.host_name_.field_2._M_allocated_capacity + 1);
    }
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,
                      CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                               local_180.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,
                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                               local_160.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  sVar2 = CONCAT44(local_1b0._4_4_,local_1b0.val_);
  std::runtime_error::runtime_error((runtime_error *)local_120,"");
  local_108._8_8_ = &local_f0;
  local_120._0_8_ = &PTR__system_error_00141ee0;
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_110 = sVar2;
  boost::throw_exception<boost::system::system_error>((system_error *)local_120);
}

Assistant:

void requestPage( const string& url ){
    // Split the URL into parts.
    string service, hostname, path;
    parseURL( url, service, hostname, path );

    // Just like tutorial 1, we start by resolving the hostname and service provided from the
    // command line. Only now we will use the asynchronous version which takes a callback function
    // as its second parameter.
    //
    // NOTE I am using the `boost::asio::placeholder`s, however you could use the normal bind
    //      placeholders. If you are using C++11's `std::bind` then you must use `std::placeholder`s
    //      instead as they are not compatible.
    tcp::resolver           resolver( io_service );
    tcp::resolver::query    query( hostname, service );
    resolver.async_resolve(
        query,
        boost::bind(
            &resolveHandler,
            boost::asio::placeholders::error,
            boost::asio::placeholders::iterator,
            url
        )
    );

    // Next we run the IO service. Note that we are doing this _after_ triggering an asynchronous
    // functon. This is very important, if the `io_service` has nothing to run then all threads
    // calling `io_service.run()` will exit. If you would like to control when the `io_service`
    // stops simply create a `boost::asio::io_service::work` object before calling
    // `io_service.run()` and then destroy that object when you are done. Note that you only need
    // one `io_service::work` object per `io_service` object.
    io_service.run();
}